

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

Type * choc::value::Type::createArray
                 (Type *__return_storage_ptr__,Type *elementType,uint32_t numElements)

{
  Content *pCVar1;
  MainType MVar2;
  Allocator *pAVar3;
  RepeatedGroup *pRVar4;
  Object *this;
  Object *pOVar5;
  Object *pOVar6;
  uint uVar7;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this_00;
  MainType local_78;
  
  MVar2 = elementType->mainType;
  this = (elementType->content).object;
  pAVar3 = elementType->allocator;
  elementType->mainType = void_;
  if (0xfffff < numElements) {
    throwError("Too many array elements");
  }
  uVar7 = (uint)MVar2;
  if (uVar7 < 0x31) {
    local_78 = MVar2;
    if ((0x1100112UL >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
      __return_storage_ptr__->mainType = primitiveArray;
      (__return_storage_ptr__->content).object =
           (Object *)((ulong)numElements << 0x20 | (ulong)MVar2);
      *(undefined8 *)((long)&__return_storage_ptr__->content + 8) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      goto LAB_001e28ed;
    }
    if ((ulong)uVar7 != 0x30) goto LAB_001e285d;
    __return_storage_ptr__->mainType = primitiveArray;
    (__return_storage_ptr__->content).object =
         (Object *)((ulong)numElements << 0x20 | (ulong)this & 0xff);
    *(ulong *)((long)&__return_storage_ptr__->content + 8) = (ulong)this >> 0x20;
  }
  else {
LAB_001e285d:
    this_00 = (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)malloc(0x18);
    this_00->items = (RepeatedGroup *)0x0;
    this_00->size = 0;
    this_00->capacity = 0;
    this_00->allocator = (Allocator *)0x0;
    pOVar5 = (elementType->content).object;
    pOVar6 = *(Object **)((long)&elementType->content + 8);
    local_78 = void_;
    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
              (this_00,this_00->size + 1);
    pRVar4 = this_00->items;
    uVar7 = this_00->size;
    pRVar4[uVar7].repetitions = numElements;
    pRVar4[uVar7].elementType.mainType = MVar2;
    pCVar1 = &pRVar4[uVar7].elementType.content;
    pCVar1->object = pOVar5;
    (&pCVar1->object)[1] = pOVar6;
    pRVar4[uVar7].elementType.allocator = pAVar3;
    this_00->size = this_00->size + 1;
    __return_storage_ptr__->mainType = complexArray;
    (__return_storage_ptr__->content).complexArray = (ComplexArray *)this_00;
  }
  __return_storage_ptr__->allocator = (Allocator *)0x0;
LAB_001e28ed:
  if ((char)local_78 < '\0') {
    if (local_78 == object) {
      if (this == (Object *)0x0) {
        return __return_storage_ptr__;
      }
      Object::~Object(this);
    }
    else {
      if (local_78 != complexArray) {
        return __return_storage_ptr__;
      }
      if (this == (Object *)0x0) {
        return __return_storage_ptr__;
      }
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)this);
    }
    if (pAVar3 == (Allocator *)0x0) {
      free(this);
    }
    else {
      (**(code **)(*(long *)pAVar3 + 0x20))(pAVar3,this);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Type::Type (Type&& other) : mainType (other.mainType), content (other.content), allocator (other.allocator)
{
    other.mainType = MainType::void_;
}